

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

VkGraphicsPipelineLibraryCreateInfoEXT *
Fossilize::find_pnext<VkGraphicsPipelineLibraryCreateInfoEXT>(VkStructureType sType,void *pNext)

{
  VkGraphicsPipelineLibraryCreateInfoEXT *pVVar1;
  undefined4 in_register_0000003c;
  
  for (pVVar1 = (VkGraphicsPipelineLibraryCreateInfoEXT *)CONCAT44(in_register_0000003c,sType);
      (pVVar1 != (VkGraphicsPipelineLibraryCreateInfoEXT *)0x0 &&
      (pVVar1->sType != VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_LIBRARY_CREATE_INFO_EXT));
      pVVar1 = (VkGraphicsPipelineLibraryCreateInfoEXT *)pVVar1->pNext) {
  }
  return pVVar1;
}

Assistant:

static const T *find_pnext(VkStructureType sType, const void *pNext)
{
	while (pNext)
	{
		auto *base_in = static_cast<const VkBaseInStructure *>(pNext);
		if (base_in->sType == sType)
			return static_cast<const T *>(pNext);
		pNext = base_in->pNext;
	}
	return nullptr;
}